

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O0

void burgalg(double *x,int N,int p,double *phi,double *var)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *__ptr;
  void *__ptr_00;
  undefined8 *__ptr_01;
  double dVar4;
  double *an;
  double *bk;
  double *fk;
  double temp2;
  double temp1;
  double u;
  double dk;
  int p1;
  int N1;
  int j;
  int i;
  double *var_local;
  double *phi_local;
  int p_local;
  int N_local;
  double *x_local;
  
  iVar3 = N + -1;
  __ptr = (double *)malloc((long)N << 3);
  __ptr_00 = malloc((long)N << 3);
  __ptr_01 = (undefined8 *)malloc((long)(p + 1) << 3);
  for (N1 = 0; N1 < N; N1 = N1 + 1) {
    dVar4 = x[N1];
    *(double *)((long)__ptr_00 + (long)N1 * 8) = dVar4;
    __ptr[N1] = dVar4;
  }
  for (N1 = 0; N1 < p + 1; N1 = N1 + 1) {
    __ptr_01[N1] = 0;
  }
  *__ptr_01 = 0x3ff0000000000000;
  u = 0.0;
  for (N1 = 0; N1 < N; N1 = N1 + 1) {
    u = __ptr[N1] * 2.0 * __ptr[N1] + u;
  }
  u = u - (*__ptr * *__ptr +
          *(double *)((long)__ptr_00 + (long)iVar3 * 8) *
          *(double *)((long)__ptr_00 + (long)iVar3 * 8));
  for (N1 = 0; N1 < p; N1 = N1 + 1) {
    temp1 = 0.0;
    for (p1 = 0; p1 <= (iVar3 - N1) + -1; p1 = p1 + 1) {
      temp1 = __ptr[N1 + p1 + 1] * *(double *)((long)__ptr_00 + (long)p1 * 8) + temp1;
    }
    dVar4 = (temp1 * -2.0) / u;
    for (p1 = 0; p1 <= (N1 + 1) / 2; p1 = p1 + 1) {
      dVar1 = (double)__ptr_01[(N1 + 1) - p1];
      dVar2 = (double)__ptr_01[p1];
      __ptr_01[p1] = dVar4 * (double)__ptr_01[(N1 + 1) - p1] + (double)__ptr_01[p1];
      __ptr_01[(N1 + 1) - p1] = dVar4 * dVar2 + dVar1;
    }
    for (p1 = 0; p1 <= (iVar3 - N1) + -1; p1 = p1 + 1) {
      dVar1 = *(double *)((long)__ptr_00 + (long)p1 * 8);
      dVar2 = __ptr[N1 + p1 + 1];
      __ptr[N1 + p1 + 1] = dVar4 * *(double *)((long)__ptr_00 + (long)p1 * 8) + __ptr[N1 + p1 + 1];
      *(double *)((long)__ptr_00 + (long)p1 * 8) = dVar4 * dVar2 + dVar1;
    }
    *var = (-dVar4 * dVar4 + 1.0) * u;
    u = -*(double *)((long)__ptr_00 + (long)((iVar3 - N1) + -1) * 8) *
        *(double *)((long)__ptr_00 + (long)((iVar3 - N1) + -1) * 8) +
        -__ptr[N1 + 1] * __ptr[N1 + 1] + *var;
    *var = *var / (double)((iVar3 - N1) * 2);
  }
  for (N1 = 0; N1 < p; N1 = N1 + 1) {
    phi[N1] = (double)__ptr_01[N1 + 1] * -1.0;
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  return;
}

Assistant:

void burgalg(double *x, int N, int p, double *phi,double *var) {
	int i, j, N1, p1;
	double dk,u,temp1,temp2;
	double *fk, *bk, *an;

	/*
	This code is the C translation of Cedrick Collomb's C++ Implemnetation of Burg's Algorithm
	with some minor modifications
	A tutorial on linear prediction and the Burg method.
	http://www.emptyloop.com/technotes/
	*/

	N1 = N;
	N = N - 1;
	p1 = p + 1;
	fk = (double*)malloc(sizeof(double) * N1);
	bk = (double*)malloc(sizeof(double)* N1);
	an = (double*)malloc(sizeof(double)* p1);

	for (i = 0; i < N1; ++i) {
		fk[i] = bk[i] = x[i];
	}

	for (i = 0; i < p1; ++i) {
		an[i] = 0.0;
		//printf("%g ", an[i]);
	}

	an[0] = 1.0;

	dk = 0.0;

	for (i = 0; i < N1; ++i) {
		dk += ( 2.0 * fk[i] * fk[i]);
	}

	dk -= (fk[0] * fk[0] + bk[N] * bk[N]);

	for (i = 0; i < p; ++i) {
		u = 0.0;
		for (j = 0; j <= N - i - 1; ++j) {
			u += (fk[i + j + 1] * bk[j]);
		}

		u = -2.0 * u / dk;
		 
		for (j = 0; j <= (i + 1) / 2; ++j) {
			temp1 = an[j] + u * an[i + 1 - j];
			temp2 = an[i + 1 - j] + u * an[j];
			an[j] = temp1;
			an[i + 1 - j] = temp2;
		}

		for (j = 0; j <= N - i - 1; ++j) {
			temp1 = fk[i + j + 1] + u * bk[j];
			temp2 = bk[j] + u * fk[i + j + 1];
			fk[i + j + 1] = temp1;
			bk[j] = temp2;
		}
		*var = (1.0 - u*u) * dk;
		dk = *var - fk[i + 1] * fk[i + 1] - bk[N - i - 1] * bk[N - i - 1];
		*var = *var / (2 * (N - i));

	}

	for (i = 0; i < p; ++i) {
		phi[i] = -1.0 * an[i+1];
	}

	free(fk);
	free(bk);
	free(an);
}